

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*,bool)::LazySerializerEmitter::LazySerializerEmitter(google::protobuf::
compiler::cpp::MessageGenerator*,google::protobuf::io::Printer__bool_
          (void *this,MessageGenerator *mg,Printer *printer,bool to_array)

{
  bool bVar1;
  FileDescriptor *file;
  bool to_array_local;
  Printer *printer_local;
  MessageGenerator *mg_local;
  LazySerializerEmitter *this_local;
  
  *(MessageGenerator **)this = mg;
  *(Printer **)((long)this + 8) = printer;
  *(bool *)((long)this + 0x10) = to_array;
  file = Descriptor::file(mg->descriptor_);
  bVar1 = HasFieldPresence(file);
  *(byte *)((long)this + 0x11) = (bVar1 ^ 0xffU) & 1;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)((long)this + 0x18));
  *(undefined4 *)((long)this + 0x30) = 0xffffffff;
  return;
}

Assistant:

LazySerializerEmitter(MessageGenerator* mg, io::Printer* printer,
                          bool to_array)
        : mg_(mg),
          printer_(printer),
          to_array_(to_array),
          eager_(!HasFieldPresence(mg->descriptor_->file())),
          cached_has_bit_index_(-1) {}